

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::type_name_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  EnumDescriptor *this_00;
  Descriptor *pDVar3;
  LogMessage *other;
  EnumDescriptor *descriptor_00;
  Descriptor *descriptor_01;
  allocator<char> local_a2;
  LogFinisher local_a1;
  LogMessage local_a0;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  undefined4 local_58;
  undefined1 local_48 [8];
  string wrapped_field_type_name;
  FieldDescriptor *wrapped_field;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  TVar2 = FieldDescriptor::type(descriptor);
  switch(TVar2) {
  case TYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"double",&local_59);
    std::allocator<char>::~allocator(&local_59);
    break;
  case TYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",&local_5a);
    std::allocator<char>::~allocator(&local_5a);
    break;
  case TYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_5b);
    std::allocator<char>::~allocator(&local_5b);
    break;
  case TYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ulong",&local_5c);
    std::allocator<char>::~allocator(&local_5c);
    break;
  case TYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_5d);
    std::allocator<char>::~allocator(&local_5d);
    break;
  case TYPE_FIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ulong",&local_5e);
    std::allocator<char>::~allocator(&local_5e);
    break;
  case TYPE_FIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint",&local_5f);
    std::allocator<char>::~allocator(&local_5f);
    break;
  case TYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_60);
    std::allocator<char>::~allocator(&local_60);
    break;
  case TYPE_STRING:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",&local_61);
    std::allocator<char>::~allocator(&local_61);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar1 = IsWrapperType(descriptor);
    if (bVar1) {
      pDVar3 = FieldDescriptor::message_type(descriptor);
      wrapped_field_type_name.field_2._8_8_ = Descriptor::field(pDVar3,0);
      type_name_abi_cxx11_
                ((string *)local_48,this,(FieldDescriptor *)wrapped_field_type_name.field_2._8_8_);
      TVar2 = FieldDescriptor::type((FieldDescriptor *)wrapped_field_type_name.field_2._8_8_);
      if ((TVar2 == TYPE_STRING) ||
         (TVar2 = FieldDescriptor::type((FieldDescriptor *)wrapped_field_type_name.field_2._8_8_),
         TVar2 == TYPE_BYTES)) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
      }
      else {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,"?");
      }
      local_58 = 1;
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      pDVar3 = FieldDescriptor::message_type(descriptor);
      GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)pDVar3,descriptor_01);
    }
    break;
  case TYPE_BYTES:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"pb::ByteString",&local_62);
    std::allocator<char>::~allocator(&local_62);
    break;
  case TYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"uint",&local_63);
    std::allocator<char>::~allocator(&local_63);
    break;
  case TYPE_ENUM:
    this_00 = FieldDescriptor::enum_type(descriptor);
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)this_00,descriptor_00);
    break;
  case TYPE_SFIXED32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_64);
    std::allocator<char>::~allocator(&local_64);
    break;
  case TYPE_SFIXED64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_65);
    std::allocator<char>::~allocator(&local_65);
    break;
  case TYPE_SINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_66);
    std::allocator<char>::~allocator(&local_66);
    break;
  case MAX_TYPE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"long",&local_67);
    std::allocator<char>::~allocator(&local_67);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0xd1);
    other = internal::LogMessage::operator<<(&local_a0,"Unknown field type.");
    internal::LogFinisher::operator=(&local_a1,other);
    internal::LogMessage::~LogMessage(&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_a2);
    std::allocator<char>::~allocator(&local_a2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::type_name(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return GetClassName(descriptor->enum_type());
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field =
            descriptor->message_type()->field(0);
        string wrapped_field_type_name = type_name(wrapped_field);
        // String and ByteString go to the same type; other wrapped types
        // go to the nullable equivalent.
        if (wrapped_field->type() == FieldDescriptor::TYPE_STRING ||
            wrapped_field->type() == FieldDescriptor::TYPE_BYTES) {
          return wrapped_field_type_name;
        } else {
          return wrapped_field_type_name + "?";
        }
      }
      return GetClassName(descriptor->message_type());
    case FieldDescriptor::TYPE_DOUBLE:
      return "double";
    case FieldDescriptor::TYPE_FLOAT:
      return "float";
    case FieldDescriptor::TYPE_INT64:
      return "long";
    case FieldDescriptor::TYPE_UINT64:
      return "ulong";
    case FieldDescriptor::TYPE_INT32:
      return "int";
    case FieldDescriptor::TYPE_FIXED64:
      return "ulong";
    case FieldDescriptor::TYPE_FIXED32:
      return "uint";
    case FieldDescriptor::TYPE_BOOL:
      return "bool";
    case FieldDescriptor::TYPE_STRING:
      return "string";
    case FieldDescriptor::TYPE_BYTES:
      return "pb::ByteString";
    case FieldDescriptor::TYPE_UINT32:
      return "uint";
    case FieldDescriptor::TYPE_SFIXED32:
      return "int";
    case FieldDescriptor::TYPE_SFIXED64:
      return "long";
    case FieldDescriptor::TYPE_SINT32:
      return "int";
    case FieldDescriptor::TYPE_SINT64:
      return "long";
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return "";
  }
}